

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::slice::shift(slice *this,ssize_t len)

{
  ssize_t len_local;
  slice *this_local;
  
  if (len < 0) {
    if ((long)this->_off < -len) {
      return false;
    }
  }
  else if ((long)this->_len < len) {
    return false;
  }
  this->_len = this->_len - len;
  this->_off = len + this->_off;
  return true;
}

Assistant:

bool slice::shift(ssize_t len)
{
	if (len < 0) {
		if (-len > (ssize_t) _off) {
			return false;
		}
	}
	else if (len > (ssize_t) _len) {
		return false;
	}
	_len -= len;
	_off += len;
	return true;
}